

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

void __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::deleteFixup
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,LinkType x,LinkType nilParent)

{
  bool bVar1;
  Dir dir_00;
  LinkType LVar2;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *pRVar3;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *pRVar4;
  LinkType in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  LinkType w;
  LinkType p;
  Dir dir;
  LinkType in_stack_ffffffffffffff88;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_stack_ffffffffffffff90;
  LinkType in_stack_ffffffffffffff98;
  RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *in_stack_ffffffffffffffa0;
  undefined8 local_48;
  Dir in_stack_ffffffffffffffc4;
  undefined8 local_10;
  
  local_10 = in_RSI;
  do {
    while( true ) {
      in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc4 & 0xffffff;
      if (local_10 != *(long *)*in_RDI) {
        bVar1 = isBlack(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffc4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc4);
      }
      if ((char)(in_stack_ffffffffffffffc4 >> 0x18) == '\0') {
        if (local_10 != -1) {
          makeBlack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        return;
      }
      local_48 = in_RDX;
      if (local_10 != -1) {
        local_48 = getParent(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      LVar2 = getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
      dir_00 = (Dir)(local_10 == LVar2);
      pRVar3 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
               getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
      bVar1 = isRed(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar1) {
        makeBlack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        makeRed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        opposite(dir_00);
        rotate(pRVar3,(LinkType)in_RDI,in_stack_ffffffffffffffc4);
        pRVar3 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
                 getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
      }
      getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
      bVar1 = isBlack(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar1) break;
LAB_0065d799:
      getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
      bVar1 = isBlack(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if (bVar1) {
        pRVar4 = pRVar3;
        opposite(dir_00);
        getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
        makeBlack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        makeRed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        rotate(pRVar4,(LinkType)in_RDI,in_stack_ffffffffffffffc4);
        pRVar4 = (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *)
                 getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
        in_stack_ffffffffffffffa0 = pRVar3;
        pRVar3 = pRVar4;
      }
      in_stack_ffffffffffffff90 = pRVar3;
      pRVar3 = in_stack_ffffffffffffff90;
      getColor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      setColor(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0);
      makeBlack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
      makeBlack(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      opposite(dir_00);
      rotate(pRVar3,(LinkType)in_RDI,in_stack_ffffffffffffffc4);
      local_10 = *(long *)*in_RDI;
      in_stack_ffffffffffffff98 = local_48;
    }
    getChild(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,kLeft);
    bVar1 = isBlack(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar1) goto LAB_0065d799;
    makeRed(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_10 = local_48;
  } while( true );
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }